

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Partial.cpp
# Opt level: O1

void __thiscall
MT32Emu::Partial::startPartial
          (Partial *this,Part *part,Poly *usePoly,PatchCache *usePatchCache,RhythmTemp *rhythmTemp,
          Partial *pairPartial)

{
  byte bVar1;
  char cVar2;
  Synth *this_00;
  PatchCache *pPVar3;
  TVF *this_01;
  PartialParam *newPartialParam;
  Partial *pPVar4;
  LA32PartialPair *pLVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  Bit32u basePitch;
  PatchTemp *pPVar9;
  Bit8u *pBVar10;
  Tables *pTVar11;
  byte bVar12;
  undefined1 *puVar13;
  PCMWaveEntry *pPVar14;
  long lVar15;
  int iVar16;
  char *pcVar17;
  char *pcVar18;
  LA32PartialPair **ppLVar19;
  
  if (usePoly == (Poly *)0x0 || usePatchCache == (PatchCache *)0x0) {
    pcVar18 = "OK";
    pcVar17 = "OK";
    if (usePoly == (Poly *)0x0) {
      pcVar17 = "*** NULL ***";
    }
    if (usePatchCache == (PatchCache *)0x0) {
      pcVar18 = "*** NULL ***";
    }
    Synth::printDebug(this->synth,
                      "[Partial %d] *** Error: Starting partial for owner %d, usePoly=%s, usePatchCache=%s"
                      ,(ulong)(uint)this->partialIndex,(ulong)(uint)this->ownerPart,pcVar17,pcVar18)
    ;
    return;
  }
  this->patchCache = usePatchCache;
  this->poly = usePoly;
  this->mixType = usePatchCache->structureMix;
  this->structurePosition = usePatchCache->structurePosition;
  if (rhythmTemp == (RhythmTemp *)0x0) {
    pPVar9 = Part::getPatchTemp(part);
    pBVar10 = &pPVar9->panpot;
  }
  else {
    pBVar10 = &rhythmTemp->panpot;
  }
  bVar1 = *pBVar10;
  if (this->mixType == 3) {
    puVar13 = PAN_NUMERATOR_SLAVE;
    if (this->structurePosition == 0) {
      puVar13 = PAN_NUMERATOR_MASTER;
    }
    cVar2 = puVar13[bVar1];
    this->mixType = 0;
    pairPartial = (Partial *)0x0;
    bVar12 = cVar2 * '\x02';
  }
  else {
    bVar6 = Synth::isNicePanningEnabled(this->synth);
    bVar12 = bVar1 & 0xe;
    if (bVar6) {
      bVar12 = bVar1;
    }
  }
  this_00 = this->synth;
  uVar7 = 0xe - bVar12;
  if (this_00->reversedStereoEnabled == false) {
    uVar7 = (uint)bVar12;
  }
  this->leftPanValue = uVar7;
  this->rightPanValue = 0xe - uVar7;
  if (this->floatMode == false) {
    if (getPanFactor(int)::firstRun == '\0') {
      getPanFactor(int)::firstRun = '\x01';
      lVar15 = 1;
      iVar16 = 0x2000;
      do {
        *(int *)(getPanFactor(int)::PAN_FACTORS + lVar15 * 4) = (int)((double)iVar16 / 14.0 + 0.5);
        lVar15 = lVar15 + 1;
        iVar16 = iVar16 + 0x2000;
      } while (lVar15 != 0xf);
    }
    this->leftPanValue = *(Bit32s *)(getPanFactor(int)::PAN_FACTORS + (long)(int)uVar7 * 4);
    if (getPanFactor(int)::firstRun == '\0') {
      getPanFactor(int)::firstRun = '\x01';
      lVar15 = 1;
      iVar16 = 0x2000;
      do {
        *(int *)(getPanFactor(int)::PAN_FACTORS + lVar15 * 4) = (int)((double)iVar16 / 14.0 + 0.5);
        lVar15 = lVar15 + 1;
        iVar16 = iVar16 + 0x2000;
      } while (lVar15 != 0xf);
    }
    this->rightPanValue = *(Bit32s *)(getPanFactor(int)::PAN_FACTORS + (long)(int)(0xe - uVar7) * 4)
    ;
  }
  bVar6 = Synth::isNicePartialMixingEnabled(this_00);
  if ((!bVar6) && ((this->partialIndex & 4) != 0)) {
    this->leftPanValue = -this->leftPanValue;
    this->rightPanValue = -this->rightPanValue;
  }
  pPVar3 = this->patchCache;
  iVar16 = 0;
  if (pPVar3->PCMPartial == true) {
    iVar8 = pPVar3->pcm;
    this->pcmNum = iVar8;
    if ((0x80 < this->synth->controlROMMap->pcmCount) && (1 < pPVar3->waveform)) {
      this->pcmNum = iVar8 + 0x80;
    }
    pPVar14 = this->synth->pcmWaves + this->pcmNum;
  }
  else {
    pPVar14 = (PCMWaveEntry *)0x0;
  }
  this->pcmWave = pPVar14;
  uVar7 = Poly::getVelocity(this->poly);
  bVar1 = (this->patchCache->srcPartial).wg.pulseWidthVeloSensitivity;
  pTVar11 = Tables::getInstance();
  iVar8 = (uint)pTVar11->pulseWidth100To255[(this->patchCache->srcPartial).wg.pulseWidth] +
          (bVar1 - 7) * (uVar7 - 0x40);
  this->pulseWidthVal = iVar8;
  if ((iVar8 < 0) || (iVar16 = 0xff, 0xff < iVar8)) {
    this->pulseWidthVal = iVar16;
  }
  this->pair = pairPartial;
  this->alreadyOutputed = false;
  TVA::reset(this->tva,part,this->patchCache->partialParam,rhythmTemp);
  TVP::reset(this->tvp,part,this->patchCache->partialParam);
  this_01 = this->tvf;
  newPartialParam = this->patchCache->partialParam;
  basePitch = TVP::getBasePitch(this->tvp);
  TVF::reset(this_01,newPartialParam,basePitch);
  pPVar4 = this->pair;
  if ((this->structurePosition == 1 && pPVar4 != (Partial *)0x0) && (this->mixType - 1U < 2)) {
    ppLVar19 = &pPVar4->la32Pair;
    uVar7 = 1;
  }
  else {
    uVar7 = 0;
    bVar6 = false;
    if (this->structurePosition == 0 && pPVar4 != (Partial *)0x0) {
      bVar6 = this->mixType - 1U < 2;
    }
    ppLVar19 = &this->la32Pair;
    (*this->la32Pair->_vptr_LA32PartialPair[2])
              (this->la32Pair,(ulong)bVar6,(ulong)(this->mixType == 1));
  }
  pLVar5 = *ppLVar19;
  pPVar14 = this->pcmWave;
  if (pPVar14 == (PCMWaveEntry *)0x0) {
    (*pLVar5->_vptr_LA32PartialPair[3])
              (pLVar5,(ulong)uVar7,(ulong)(this->patchCache->waveform & 1),
               (ulong)(byte)this->pulseWidthVal,
               (ulong)(byte)((this->patchCache->srcPartial).tvf.resonance + 1));
  }
  else {
    (*pLVar5->_vptr_LA32PartialPair[4])
              (pLVar5,(ulong)uVar7,this->synth->pcmROMData + pPVar14->addr,(ulong)pPVar14->len,
               (ulong)pPVar14->loop);
  }
  if (((this->pair != (Partial *)0x0) && (this->structurePosition == 0)) && (this->mixType - 1U < 2)
     ) {
    return;
  }
  (*this->la32Pair->_vptr_LA32PartialPair[5])(this->la32Pair,1);
  return;
}

Assistant:

void Partial::startPartial(const Part *part, Poly *usePoly, const PatchCache *usePatchCache, const MemParams::RhythmTemp *rhythmTemp, Partial *pairPartial) {
	if (usePoly == NULL || usePatchCache == NULL) {
		synth->printDebug("[Partial %d] *** Error: Starting partial for owner %d, usePoly=%s, usePatchCache=%s", partialIndex, ownerPart, usePoly == NULL ? "*** NULL ***" : "OK", usePatchCache == NULL ? "*** NULL ***" : "OK");
		return;
	}
	patchCache = usePatchCache;
	poly = usePoly;
	mixType = patchCache->structureMix;
	structurePosition = patchCache->structurePosition;

	Bit8u panSetting = rhythmTemp != NULL ? rhythmTemp->panpot : part->getPatchTemp()->panpot;
	if (mixType == 3) {
		if (structurePosition == 0) {
			panSetting = PAN_NUMERATOR_MASTER[panSetting] << 1;
		} else {
			panSetting = PAN_NUMERATOR_SLAVE[panSetting] << 1;
		}
		// Do a normal mix independent of any pair partial.
		mixType = 0;
		pairPartial = NULL;
	} else if (!synth->isNicePanningEnabled()) {
		// Mok wanted an option for smoother panning, and we love Mok.
		// CONFIRMED by Mok: exactly bytes like this (right shifted) are sent to the LA32.
		panSetting &= 0x0E;
	}

	leftPanValue = synth->reversedStereoEnabled ? 14 - panSetting : panSetting;
	rightPanValue = 14 - leftPanValue;

	if (!floatMode) {
		leftPanValue = getPanFactor(leftPanValue);
		rightPanValue = getPanFactor(rightPanValue);
	}

	// SEMI-CONFIRMED: From sample analysis:
	// Found that timbres with 3 or 4 partials (i.e. one using two partial pairs) are mixed in two different ways.
	// Either partial pairs are added or subtracted, it depends on how the partial pairs are allocated.
	// It seems that partials are grouped into quarters and if the partial pairs are allocated in different quarters the subtraction happens.
	// Though, this matters little for the majority of timbres, it becomes crucial for timbres which contain several partials that sound very close.
	// In this case that timbre can sound totally different depending on the way it is mixed up.
	// Most easily this effect can be displayed with the help of a special timbre consisting of several identical square wave partials (3 or 4).
	// Say, it is 3-partial timbre. Just play any two notes simultaneously and the polys very probably are mixed differently.
	// Moreover, the partial allocator retains the last partial assignment it did and all the subsequent notes will sound the same as the last released one.
	// The situation is better with 4-partial timbres since then a whole quarter is assigned for each poly. However, if a 3-partial timbre broke the normal
	// whole-quarter assignment or after some partials got aborted, even 4-partial timbres can be found sounding differently.
	// This behaviour is also confirmed with two more special timbres: one with identical sawtooth partials, and one with PCM wave 02.
	// For my personal taste, this behaviour rather enriches the sounding and should be emulated.
	if (!synth->isNicePartialMixingEnabled() && (partialIndex & 4)) {
		leftPanValue = -leftPanValue;
		rightPanValue = -rightPanValue;
	}

	if (patchCache->PCMPartial) {
		pcmNum = patchCache->pcm;
		if (synth->controlROMMap->pcmCount > 128) {
			// CM-32L, etc. support two "banks" of PCMs, selectable by waveform type parameter.
			if (patchCache->waveform > 1) {
				pcmNum += 128;
			}
		}
		pcmWave = &synth->pcmWaves[pcmNum];
	} else {
		pcmWave = NULL;
	}

	// CONFIRMED: pulseWidthVal calculation is based on information from Mok
	pulseWidthVal = (poly->getVelocity() - 64) * (patchCache->srcPartial.wg.pulseWidthVeloSensitivity - 7) + Tables::getInstance().pulseWidth100To255[patchCache->srcPartial.wg.pulseWidth];
	if (pulseWidthVal < 0) {
		pulseWidthVal = 0;
	} else if (pulseWidthVal > 255) {
		pulseWidthVal = 255;
	}

	pair = pairPartial;
	alreadyOutputed = false;
	tva->reset(part, patchCache->partialParam, rhythmTemp);
	tvp->reset(part, patchCache->partialParam);
	tvf->reset(patchCache->partialParam, tvp->getBasePitch());

	LA32PartialPair::PairType pairType;
	LA32PartialPair *useLA32Pair;
	if (isRingModulatingSlave()) {
		pairType = LA32PartialPair::SLAVE;
		useLA32Pair = pair->la32Pair;
	} else {
		pairType = LA32PartialPair::MASTER;
		la32Pair->init(hasRingModulatingSlave(), mixType == 1);
		useLA32Pair = la32Pair;
	}
	if (isPCM()) {
		useLA32Pair->initPCM(pairType, &synth->pcmROMData[pcmWave->addr], pcmWave->len, pcmWave->loop);
	} else {
		useLA32Pair->initSynth(pairType, (patchCache->waveform & 1) != 0, pulseWidthVal, patchCache->srcPartial.tvf.resonance + 1);
	}
	if (!hasRingModulatingSlave()) {
		la32Pair->deactivate(LA32PartialPair::SLAVE);
	}
}